

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.h
# Opt level: O3

enable_if_t<std::is_base_of<_::acto::actor,_Console>::value,_actor_ref> __thiscall
acto::spawn<Console>(acto *this,actor_thread thread_opt)

{
  actor *this_00;
  object_t *an_object;
  pointer *__ptr;
  _Head_base<0UL,_acto::actor_*,_false> local_28;
  actor_ref local_20;
  
  local_20.object_ = (object_t *)0x0;
  this_00 = (actor *)operator_new(0x58);
  Console::Console((Console *)this_00);
  local_28._M_head_impl = this_00;
  an_object = core::make_instance(&local_20,thread_opt,
                                  (unique_ptr<acto::actor,_std::default_delete<acto::actor>_> *)
                                  &local_28);
  actor_ref::actor_ref((actor_ref *)this,an_object,false);
  if (local_28._M_head_impl != (actor *)0x0) {
    (*((actor *)&(local_28._M_head_impl)->_vptr_actor)->_vptr_actor[1])();
  }
  local_28._M_head_impl = (actor *)0x0;
  actor_ref::~actor_ref(&local_20);
  return (enable_if_t<std::is_base_of<_::acto::actor,_Console>::value,_actor_ref>)(object_t *)this;
}

Assistant:

inline std::enable_if_t<std::is_base_of<::acto::actor, T>::value, actor_ref>
spawn(const actor_thread thread_opt, P&&... p) {
  return actor_ref(
    core::make_instance(actor_ref(), thread_opt,
                        std::make_unique<T>(std::forward<P>(p)...)),
    false);
}